

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Dim anon_unknown.dwarf_b0093a::TranslateDimensionality(TSampler *sampler)

{
  TSampler *sampler_local;
  
  switch(sampler->field_0x1) {
  case 1:
    sampler_local._4_4_ = Dim1D;
    break;
  case 2:
    sampler_local._4_4_ = Dim2D;
    break;
  case 3:
    sampler_local._4_4_ = Dim3D;
    break;
  case 4:
    sampler_local._4_4_ = Cube;
    break;
  case 5:
    sampler_local._4_4_ = DimRect;
    break;
  case 6:
    sampler_local._4_4_ = Buffer;
    break;
  case 7:
    sampler_local._4_4_ = DimSubpassData;
    break;
  case 8:
    sampler_local._4_4_ = DimTileImageDataEXT;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x162,
                  "spv::Dim (anonymous namespace)::TranslateDimensionality(const glslang::TSampler &)"
                 );
  }
  return sampler_local._4_4_;
}

Assistant:

spv::Dim TranslateDimensionality(const glslang::TSampler& sampler)
{
    switch (sampler.dim) {
    case glslang::Esd1D:      return spv::Dim1D;
    case glslang::Esd2D:      return spv::Dim2D;
    case glslang::Esd3D:      return spv::Dim3D;
    case glslang::EsdCube:    return spv::DimCube;
    case glslang::EsdRect:    return spv::DimRect;
    case glslang::EsdBuffer:  return spv::DimBuffer;
    case glslang::EsdSubpass: return spv::DimSubpassData;
    case glslang::EsdAttachmentEXT: return spv::DimTileImageDataEXT;
    default:
        assert(0);
        return spv::Dim2D;
    }
}